

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86_fma::create_group_ops(ConvolutionDepthWise_x86_fma *this,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  int *piVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined8 *puVar9;
  void **ppvVar10;
  _func_int ***ppp_Var11;
  int i;
  uint uVar12;
  pointer ppLVar13;
  Layer *pLVar14;
  long lVar15;
  pointer ppLVar16;
  ulong uVar17;
  int iVar18;
  void *in_R8;
  Allocator *pAVar19;
  void *pvVar20;
  _func_int **pp_Var21;
  long lVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [32];
  undefined1 auVar27 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar38 [16];
  undefined1 in_ZMM11 [64];
  ParamDict pd;
  Mat local_2d8;
  undefined1 auStack_28c [8];
  int local_284;
  uint local_280;
  int local_27c;
  undefined1 local_278 [44];
  int iStack_24c;
  undefined8 uStack_248;
  int local_240 [2];
  size_t local_238;
  Allocator *local_230;
  int iStack_228;
  undefined4 uStack_224;
  int iStack_220;
  int iStack_21c;
  uint uStack_218;
  Allocator *local_210;
  undefined8 local_208;
  ulong uStack_200;
  uint local_1f8;
  size_t local_1f0;
  _func_int **local_1e8;
  int *piStack_1e0;
  size_t sStack_1d8;
  int iStack_1d0;
  Allocator *local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  int local_1b0;
  size_t local_1a8;
  void *local_1a0;
  int *piStack_198;
  size_t sStack_190;
  int iStack_188;
  Allocator *local_180;
  undefined4 local_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 local_168;
  undefined8 local_160;
  void *local_158;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  int iStack_140;
  Allocator *local_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined4 local_120;
  undefined8 local_118;
  Mat local_108;
  undefined8 *local_b8;
  void **local_b0;
  undefined8 *local_a8;
  _func_int ***local_a0;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_98;
  size_t local_90;
  Allocator *local_88;
  size_t local_80;
  size_t local_78;
  Mat *local_70;
  size_t local_68;
  Option *local_60;
  undefined1 local_58 [16];
  ParamDict local_40;
  
  iVar2 = (this->super_ConvolutionDepthWise).num_output;
  iVar18 = (this->super_ConvolutionDepthWise).kernel_h * (this->super_ConvolutionDepthWise).kernel_w
  ;
  iVar3 = (this->super_ConvolutionDepthWise).group;
  uVar17 = (long)(this->super_ConvolutionDepthWise).weight_data_size / (long)iVar3;
  uVar17 = (long)((ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 | uVar17 & 0xffffffff) / (long)iVar18;
  ppLVar16 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  ppLVar13 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_60 = opt;
  if (0 < (int)((ulong)((long)ppLVar16 - (long)ppLVar13) >> 3)) {
    lVar22 = 0;
    do {
      if (ppLVar13[lVar22] != (Layer *)0x0) {
        (*ppLVar13[lVar22]->_vptr_Layer[1])();
      }
      lVar22 = lVar22 + 1;
      ppLVar13 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppLVar16 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    } while (lVar22 < (int)((ulong)((long)ppLVar16 - (long)ppLVar13) >> 3));
  }
  local_98 = &this->group_ops;
  if (ppLVar16 != ppLVar13) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar13;
  }
  iVar4 = (this->super_ConvolutionDepthWise).group;
  i = (this->super_ConvolutionDepthWise).num_output / iVar4;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_98,(long)iVar4);
  if (0 < (this->super_ConvolutionDepthWise).group) {
    local_27c = iVar18 * i *
                (((int)((long)((ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 | uVar17 & 0xffffffff) /
                       (long)(iVar2 / iVar3)) * iVar3) / iVar4);
    local_68 = (size_t)local_27c;
    local_78 = (size_t)i;
    local_70 = &(this->super_ConvolutionDepthWise).activation_params;
    local_a0 = &local_1e8;
    local_a8 = &local_1c0;
    local_b0 = &local_1a0;
    local_b8 = (undefined8 *)&local_178;
    local_58._8_8_ = 0x8000000000000000;
    local_58._0_8_ = 0x8000000000000000;
    lVar22 = 0;
    do {
      auVar38 = in_ZMM11._0_16_;
      auVar26 = in_ZMM10._0_16_;
      sVar5 = (this->super_ConvolutionDepthWise).weight_data.elemsize;
      local_278._0_8_ =
           lVar22 * local_68 * sVar5 + (long)(this->super_ConvolutionDepthWise).weight_data.data;
      local_278._24_4_ = (this->super_ConvolutionDepthWise).weight_data.elempack;
      local_278._32_8_ = (this->super_ConvolutionDepthWise).weight_data.allocator;
      local_278._8_4_ = 0;
      local_278._12_4_ = 0;
      local_278._16_4_ = (undefined4)sVar5;
      local_278._20_4_ = (undefined4)(sVar5 >> 0x20);
      iStack_24c = (int)local_68;
      local_278._40_4_ = 1;
      uStack_248._0_4_ = 1;
      uStack_248._4_4_ = 1;
      local_240[0] = 1;
      local_238 = local_68;
      Mat::clone(&local_108,(__fn *)local_278,(void *)0x0,1,in_R8);
      piVar6 = (int *)CONCAT44(local_278._12_4_,local_278._8_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if ((Allocator *)local_278._32_8_ == (Allocator *)0x0) {
            if ((void *)local_278._0_8_ != (void *)0x0) {
              free((void *)local_278._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_278._32_8_)[3])();
          }
        }
      }
      local_238 = 0;
      local_278._0_8_ = (void *)0x0;
      local_278._8_4_ = 0;
      local_278._12_4_ = 0;
      local_278._16_4_ = 0;
      local_278._20_4_ = 0;
      local_278._24_4_ = 0;
      stack0xfffffffffffffdb0 = ZEXT816(0);
      local_240[0] = 0;
      bVar23 = (this->super_ConvolutionDepthWise).bias_term == 0;
      if (bVar23) {
        pAVar19 = (Allocator *)0x0;
        local_80 = 0;
        local_280 = 0;
        local_88 = (Allocator *)0x0;
        local_284 = 0;
        local_90 = 0;
      }
      else {
        local_80 = (this->super_ConvolutionDepthWise).bias_data.elemsize;
        pAVar19 = (Allocator *)
                  (lVar22 * local_78 * local_80 +
                  (long)(this->super_ConvolutionDepthWise).bias_data.data);
        local_280 = (this->super_ConvolutionDepthWise).bias_data.elempack;
        local_88 = (this->super_ConvolutionDepthWise).bias_data.allocator;
        local_90 = local_78;
        local_284 = i;
      }
      bVar23 = !bVar23;
      pLVar14 = create_layer_cpu(6);
      ParamDict::ParamDict(&local_40);
      ParamDict::set(&local_40,0,i);
      ParamDict::set(&local_40,1,(this->super_ConvolutionDepthWise).kernel_w);
      ParamDict::set(&local_40,0xb,(this->super_ConvolutionDepthWise).kernel_h);
      ParamDict::set(&local_40,2,(this->super_ConvolutionDepthWise).dilation_w);
      ParamDict::set(&local_40,0xc,(this->super_ConvolutionDepthWise).dilation_h);
      ParamDict::set(&local_40,3,(this->super_ConvolutionDepthWise).stride_w);
      ParamDict::set(&local_40,0xd,(this->super_ConvolutionDepthWise).stride_h);
      ParamDict::set(&local_40,4,0);
      ParamDict::set(&local_40,0xe,0);
      ParamDict::set(&local_40,5,(this->super_ConvolutionDepthWise).bias_term);
      ParamDict::set(&local_40,6,local_27c);
      ParamDict::set(&local_40,8,(this->super_ConvolutionDepthWise).int8_scale_term);
      ParamDict::set(&local_40,9,(this->super_ConvolutionDepthWise).activation_type);
      ParamDict::set(&local_40,10,local_70);
      (*pLVar14->_vptr_Layer[2])(pLVar14,&local_40);
      if ((this->super_ConvolutionDepthWise).bias_term == 0) {
        lVar15 = 0x40;
        auVar25._0_12_ = ZEXT812(0);
        auVar25._12_4_ = 0;
        do {
          *(undefined8 *)(local_278 + lVar15) = 0;
          *(undefined1 (*) [16])((long)&local_2d8.allocator + lVar15) = auVar25;
          *(undefined1 (*) [16])((long)&local_2d8.w + lVar15) = auVar25;
          *(undefined1 (*) [16])((long)&local_2d8.cstep + lVar15) = auVar25;
          *(undefined1 (*) [16])(auStack_28c + lVar15) = auVar25;
          lVar15 = lVar15 + 0x48;
        } while (lVar15 != 0x160);
        piVar6 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = (int *)CONCAT44(local_278._12_4_,local_278._8_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if ((Allocator *)local_278._32_8_ == (Allocator *)0x0) {
              if ((void *)local_278._0_8_ != (void *)0x0) {
                free((void *)local_278._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_278._32_8_)[3])();
            }
          }
        }
        local_278._0_8_ = local_108.data;
        local_278._8_4_ = local_108.refcount._0_4_;
        local_278._12_4_ = local_108.refcount._4_4_;
        local_278._16_4_ = (undefined4)local_108.elemsize;
        local_278._20_4_ = local_108.elemsize._4_4_;
        local_278._24_4_ = local_108.elempack;
        local_278._32_8_ = local_108.allocator;
        uStack_248._0_4_ = local_108.h;
        uStack_248._4_4_ = local_108.d;
        local_278._40_4_ = local_108.dims;
        iStack_24c = local_108.w;
        local_240[0] = local_108.c;
        local_238 = local_108.cstep;
        if ((this->super_ConvolutionDepthWise).int8_scale_term != 0) {
          local_2d8.cstep = 0;
          local_2d8.data = (Allocator *)0x0;
          local_2d8.refcount._0_4_ = 0;
          local_2d8.refcount._4_4_ = 0;
          local_2d8.elemsize._0_4_ = 0;
          local_2d8.elempack = 0;
          local_2d8.elemsize._4_4_ = (int)local_2d8.refcount;
          local_2d8.allocator = (Allocator *)local_2d8.data;
          local_2d8.dims = (int)local_2d8.refcount;
          local_2d8.w = local_2d8.elempack;
          local_2d8.h = (int)local_2d8.elemsize;
          local_2d8.d = (int)local_2d8.refcount;
          local_2d8.c = local_2d8.elempack;
          Mat::create(&local_2d8,i,4,(Allocator *)0x0);
          auVar8 = _DAT_005ff860;
          auVar7 = _DAT_005ff840;
          uVar12 = local_2d8.c * (int)local_2d8.cstep;
          auVar26 = vpcmpeqd_avx(auVar26,auVar26);
          if (0 < (int)uVar12) {
            auVar27._8_8_ = 0;
            auVar27._0_8_ = (ulong)uVar12 - 1;
            auVar25 = vpshufd_avx(auVar27,0x44);
            uVar1 = *(undefined4 *)
                     ((long)(this->super_ConvolutionDepthWise).weight_data_int8_scales.data +
                     lVar22 * 4);
            auVar29._4_4_ = uVar1;
            auVar29._0_4_ = uVar1;
            auVar29._8_4_ = uVar1;
            auVar29._12_4_ = uVar1;
            auVar29._16_4_ = uVar1;
            auVar29._20_4_ = uVar1;
            auVar29._24_4_ = uVar1;
            auVar29._28_4_ = uVar1;
            uVar17 = 0;
            do {
              auVar31._8_8_ = 0;
              auVar31._0_8_ = uVar17;
              auVar27 = vpshufd_avx(auVar31,0x44);
              auVar34._16_16_ = auVar27;
              auVar34._0_16_ = auVar27;
              auVar35 = vorps_avx(auVar34,auVar7);
              auVar34 = vorps_avx(auVar8,auVar34);
              auVar27 = vpcmpgtq_avx(local_58 ^ auVar34._16_16_,local_58 ^ auVar25);
              auVar31 = vpcmpgtq_avx(local_58 ^ auVar34._0_16_,local_58 ^ auVar25);
              auVar27 = vpackssdw_avx(auVar31,auVar27);
              auVar31 = vpcmpgtq_avx(local_58 ^ auVar35._16_16_,local_58 ^ auVar25);
              auVar37._0_4_ = local_58._0_4_ ^ auVar35._0_4_;
              auVar37._4_4_ = local_58._4_4_ ^ auVar35._4_4_;
              auVar37._8_4_ = local_58._8_4_ ^ auVar35._8_4_;
              auVar37._12_4_ = local_58._12_4_ ^ auVar35._12_4_;
              auVar37 = vpcmpgtq_avx(auVar37,local_58 ^ auVar25);
              auVar31 = vpackssdw_avx(auVar37,auVar31);
              auVar27 = vpackssdw_avx(auVar26 ^ auVar31,auVar26 ^ auVar27);
              auVar31 = vpmovsxwd_avx(auVar27);
              auVar27 = vpunpckhwd_avx(auVar27,auVar27);
              auVar35._16_16_ = auVar27;
              auVar35._0_16_ = auVar31;
              auVar35 = vmaskmovps_avx(auVar35,auVar29);
              *(undefined1 (*) [32])((long)(_func_int ***)local_2d8.data + uVar17 * 4) = auVar35;
              uVar17 = uVar17 + 8;
            } while ((uVar12 + 7 & 0xfffffff8) != uVar17);
          }
          piVar6 = (int *)CONCAT44(local_2d8.refcount._4_4_,(int)local_2d8.refcount);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          piVar6 = (int *)CONCAT44(uStack_224,iStack_228);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_210 == (Allocator *)0x0) {
                if (local_230 != (Allocator *)0x0) {
                  free(local_230);
                }
              }
              else {
                (*local_210->_vptr_Allocator[3])();
              }
            }
          }
          local_230 = (Allocator *)local_2d8.data;
          iStack_228 = (int)local_2d8.refcount;
          uStack_224 = local_2d8.refcount._4_4_;
          iStack_220 = (int)local_2d8.elemsize;
          iStack_21c = local_2d8.elemsize._4_4_;
          uStack_218 = local_2d8.elempack;
          local_210 = local_2d8.allocator;
          local_208 = CONCAT44(local_2d8.w,local_2d8.dims);
          uStack_200 = CONCAT44(local_2d8.d,local_2d8.h);
          local_1f8 = local_2d8.c;
          local_1f0 = local_2d8.cstep;
          sVar5 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elemsize;
          pp_Var21 = (_func_int **)
                     (sVar5 * lVar22 +
                     (long)(this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data);
          iVar2 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elempack;
          pAVar19 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.allocator;
          if (piStack_1e0 != (int *)0x0) {
            LOCK();
            *piStack_1e0 = *piStack_1e0 + -1;
            UNLOCK();
            if (*piStack_1e0 == 0) {
              if (local_1c8 == (Allocator *)0x0) {
                if (local_1e8 != (_func_int **)0x0) {
                  free(local_1e8);
                }
              }
              else {
                (*local_1c8->_vptr_Allocator[3])();
              }
            }
          }
          ppp_Var11 = local_a0;
          *(undefined8 *)((long)local_a0 + 0xc) = 0;
          *(undefined8 *)((long)ppp_Var11 + 0x14) = 0;
          *ppp_Var11 = (_func_int **)0x0;
          ppp_Var11[1] = (_func_int **)0x0;
          puVar9 = local_a8;
          *local_a8 = 0;
          puVar9[1] = 0;
          *(undefined4 *)(puVar9 + 2) = 0;
          piStack_1e0 = (int *)0x0;
          local_1c0 = 0x100000001;
          uStack_1b8 = 0x100000001;
          local_1b0 = 1;
          local_1a8 = 1;
          piVar6 = (int *)CONCAT44(local_2d8.refcount._4_4_,(int)local_2d8.refcount);
          local_1e8 = pp_Var21;
          sStack_1d8 = sVar5;
          iStack_1d0 = iVar2;
          local_1c8 = pAVar19;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_2d8.allocator == (Allocator *)0x0) {
                if ((Allocator *)local_2d8.data != (Allocator *)0x0) {
                  free(local_2d8.data);
                }
              }
              else {
                (*(local_2d8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_2d8.cstep = 0;
          local_2d8.data = (void *)0x0;
          local_2d8.refcount._0_4_ = 0;
          local_2d8.refcount._4_4_ = 0;
          local_2d8.elemsize._0_4_ = 0;
          local_2d8.elemsize._4_4_ = 0;
          local_2d8.elempack = 0;
          local_2d8.dims = 0;
          local_2d8.w = 0;
          local_2d8.h = 0;
          local_2d8.d = 0;
          local_2d8.c = 0;
        }
        if (100 < (this->super_ConvolutionDepthWise).int8_scale_term) {
          sVar5 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elemsize;
          pvVar20 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.data;
          iVar2 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elempack;
          pAVar19 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.allocator;
          if (piStack_198 != (int *)0x0) {
            LOCK();
            *piStack_198 = *piStack_198 + -1;
            UNLOCK();
            if (*piStack_198 == 0) {
              if (local_180 == (Allocator *)0x0) {
                if (local_1a0 != (void *)0x0) {
                  free(local_1a0);
                }
              }
              else {
                (*local_180->_vptr_Allocator[3])();
              }
            }
          }
          ppvVar10 = local_b0;
          *(undefined8 *)((long)local_b0 + 0xc) = 0;
          *(undefined8 *)((long)ppvVar10 + 0x14) = 0;
          *ppvVar10 = (void *)0x0;
          ppvVar10[1] = (void *)0x0;
          puVar9 = local_b8;
          *local_b8 = 0;
          puVar9[1] = 0;
          *(undefined4 *)(puVar9 + 2) = 0;
          piStack_198 = (int *)0x0;
          local_178 = 1;
          uStack_174 = 1;
          uStack_170 = 1;
          uStack_16c = 1;
          local_168 = 1;
          local_160 = 1;
          local_1a0 = (void *)(sVar5 * lVar22 + (long)pvVar20);
          sStack_190 = sVar5;
          iStack_188 = iVar2;
          local_180 = pAVar19;
        }
        in_ZMM10 = ZEXT1664(auVar26);
        in_ZMM11 = ZEXT1664(auVar38);
        ModelBinFromMatArray::ModelBinFromMatArray
                  ((ModelBinFromMatArray *)&local_2d8,(Mat *)local_278);
        (*pLVar14->_vptr_Layer[3])(pLVar14,&local_2d8);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_2d8);
        lVar15 = 0xd8;
        do {
          piVar6 = *(int **)(local_278 + lVar15 + 8);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (*(long **)(local_278 + lVar15 + 0x20) == (long *)0x0) {
                if (*(void **)(local_278 + lVar15) != (void *)0x0) {
                  free(*(void **)(local_278 + lVar15));
                }
              }
              else {
                (**(code **)(**(long **)(local_278 + lVar15 + 0x20) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_238 + lVar15) = 0;
          *(undefined8 *)(local_278 + lVar15 + 0xc) = 0;
          *(undefined8 *)(local_278 + lVar15 + 0x14) = 0;
          *(undefined8 *)(local_278 + lVar15) = 0;
          *(undefined8 *)(local_278 + lVar15 + 8) = 0;
          *(undefined8 *)(local_278 + lVar15 + 0x28) = 0;
          *(undefined8 *)((long)local_240 + lVar15 + -8) = 0;
          *(undefined4 *)((long)local_240 + lVar15) = 0;
          lVar15 = lVar15 + -0x48;
        } while (lVar15 != -0x48);
      }
      else {
        lVar15 = 0x40;
        auVar24._0_12_ = ZEXT812(0);
        auVar24._12_4_ = 0;
        do {
          *(undefined8 *)(local_278 + lVar15) = 0;
          *(undefined1 (*) [16])((long)&local_2d8.allocator + lVar15) = auVar24;
          *(undefined1 (*) [16])((long)&local_2d8.w + lVar15) = auVar24;
          *(undefined1 (*) [16])((long)&local_2d8.cstep + lVar15) = auVar24;
          *(undefined1 (*) [16])(auStack_28c + lVar15) = auVar24;
          lVar15 = lVar15 + 0x48;
        } while (lVar15 != 0x1a8);
        piVar6 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = (int *)CONCAT44(local_278._12_4_,local_278._8_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if ((Allocator *)local_278._32_8_ == (Allocator *)0x0) {
              if ((void *)local_278._0_8_ != (void *)0x0) {
                free((void *)local_278._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_278._32_8_)[3])();
            }
          }
        }
        local_278._0_8_ = local_108.data;
        local_278._8_4_ = local_108.refcount._0_4_;
        local_278._12_4_ = local_108.refcount._4_4_;
        local_278._16_4_ = (undefined4)local_108.elemsize;
        local_278._20_4_ = local_108.elemsize._4_4_;
        local_278._24_4_ = local_108.elempack;
        local_278._32_8_ = local_108.allocator;
        uStack_248._0_4_ = local_108.h;
        uStack_248._4_4_ = local_108.d;
        local_278._40_4_ = local_108.dims;
        iStack_24c = local_108.w;
        local_240[0] = local_108.c;
        local_238 = local_108.cstep;
        piVar6 = (int *)CONCAT44(uStack_224,iStack_228);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_210 == (Allocator *)0x0) {
              if (local_230 != (Allocator *)0x0) {
                free(local_230);
              }
            }
            else {
              (*local_210->_vptr_Allocator[3])();
            }
          }
        }
        iStack_228 = 0;
        uStack_224 = 0;
        iStack_220 = (int)local_80;
        iStack_21c = (int)(local_80 >> 0x20);
        uStack_218 = local_280;
        local_210 = local_88;
        local_1f8 = (uint)bVar23;
        local_208 = CONCAT44(local_284,local_1f8);
        uStack_200 = (ulong)CONCAT14(bVar23,local_1f8);
        local_1f0 = local_90;
        local_230 = pAVar19;
        if ((this->super_ConvolutionDepthWise).int8_scale_term != 0) {
          local_2d8.cstep = 0;
          local_2d8.data = (_func_int **)0x0;
          local_2d8.refcount._0_4_ = 0;
          local_2d8.refcount._4_4_ = 0;
          local_2d8.elemsize._0_4_ = 0;
          local_2d8.elemsize._4_4_ = 0;
          local_2d8.elempack = 0;
          local_2d8.h = 0;
          local_2d8.d = 0;
          local_2d8.c = 0;
          local_2d8.allocator = (Allocator *)0x0;
          local_2d8.dims = 0;
          local_2d8.w = 0;
          Mat::create(&local_2d8,i,4,(Allocator *)0x0);
          auVar8 = _DAT_005ff860;
          auVar7 = _DAT_005ff840;
          uVar12 = local_2d8.c * (int)local_2d8.cstep;
          auVar38 = vpcmpeqd_avx(auVar38,auVar38);
          if (0 < (int)uVar12) {
            auVar26._8_8_ = 0;
            auVar26._0_8_ = (ulong)uVar12 - 1;
            auVar26 = vpshufd_avx(auVar26,0x44);
            uVar1 = *(undefined4 *)
                     ((long)(this->super_ConvolutionDepthWise).weight_data_int8_scales.data +
                     lVar22 * 4);
            auVar28._4_4_ = uVar1;
            auVar28._0_4_ = uVar1;
            auVar28._8_4_ = uVar1;
            auVar28._12_4_ = uVar1;
            auVar28._16_4_ = uVar1;
            auVar28._20_4_ = uVar1;
            auVar28._24_4_ = uVar1;
            auVar28._28_4_ = uVar1;
            uVar17 = 0;
            do {
              auVar30._8_8_ = 0;
              auVar30._0_8_ = uVar17;
              auVar25 = vpshufd_avx(auVar30,0x44);
              auVar32._16_16_ = auVar25;
              auVar32._0_16_ = auVar25;
              auVar29 = vorps_avx(auVar7,auVar32);
              auVar35 = vorps_avx(auVar8,auVar32);
              auVar25 = vpcmpgtq_avx(local_58 ^ auVar35._16_16_,local_58 ^ auVar26);
              auVar27 = vpcmpgtq_avx(local_58 ^ auVar35._0_16_,local_58 ^ auVar26);
              auVar25 = vpackssdw_avx(auVar27,auVar25);
              auVar27 = vpcmpgtq_avx(local_58 ^ auVar29._16_16_,local_58 ^ auVar26);
              auVar36._0_4_ = local_58._0_4_ ^ auVar29._0_4_;
              auVar36._4_4_ = local_58._4_4_ ^ auVar29._4_4_;
              auVar36._8_4_ = local_58._8_4_ ^ auVar29._8_4_;
              auVar36._12_4_ = local_58._12_4_ ^ auVar29._12_4_;
              auVar31 = vpcmpgtq_avx(auVar36,local_58 ^ auVar26);
              auVar27 = vpackssdw_avx(auVar31,auVar27);
              auVar25 = vpackssdw_avx(auVar38 ^ auVar27,auVar38 ^ auVar25);
              auVar27 = vpmovsxwd_avx(auVar25);
              auVar25 = vpunpckhwd_avx(auVar25,auVar25);
              auVar33._16_16_ = auVar25;
              auVar33._0_16_ = auVar27;
              auVar29 = vmaskmovps_avx(auVar33,auVar28);
              *(undefined1 (*) [32])((long)local_2d8.data + uVar17 * 4) = auVar29;
              uVar17 = uVar17 + 8;
            } while ((uVar12 + 7 & 0xfffffff8) != uVar17);
          }
          piVar6 = (int *)CONCAT44(local_2d8.refcount._4_4_,(int)local_2d8.refcount);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          auVar26 = local_58;
          if (piStack_1e0 != (int *)0x0) {
            LOCK();
            *piStack_1e0 = *piStack_1e0 + -1;
            UNLOCK();
            if (*piStack_1e0 == 0) {
              if (local_1c8 == (Allocator *)0x0) {
                if (local_1e8 != (_func_int **)0x0) {
                  free(local_1e8);
                }
              }
              else {
                (*local_1c8->_vptr_Allocator[3])();
              }
            }
          }
          ppp_Var11 = local_a0;
          *(undefined8 *)((long)local_a0 + 0xc) = 0;
          *(undefined8 *)((long)ppp_Var11 + 0x14) = 0;
          *ppp_Var11 = (_func_int **)0x0;
          ppp_Var11[1] = (_func_int **)0x0;
          puVar9 = local_a8;
          *local_a8 = 0;
          puVar9[1] = 0;
          *(undefined4 *)(puVar9 + 2) = 0;
          piStack_1e0 = (int *)CONCAT44(local_2d8.refcount._4_4_,(int)local_2d8.refcount);
          local_1e8 = (_func_int **)local_2d8.data;
          sStack_1d8 = CONCAT44(local_2d8.elemsize._4_4_,(int)local_2d8.elemsize);
          iStack_1d0 = local_2d8.elempack;
          local_1c8 = local_2d8.allocator;
          local_1c0 = CONCAT44(local_2d8.w,local_2d8.dims);
          uStack_1b8 = CONCAT44(local_2d8.d,local_2d8.h);
          local_1b0 = local_2d8.c;
          local_1a8 = local_2d8.cstep;
          sVar5 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elemsize;
          pvVar20 = (void *)(sVar5 * lVar22 +
                            (long)(this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data);
          iVar2 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elempack;
          pAVar19 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.allocator;
          if (piStack_198 != (int *)0x0) {
            LOCK();
            *piStack_198 = *piStack_198 + -1;
            UNLOCK();
            if (*piStack_198 == 0) {
              if (local_180 == (Allocator *)0x0) {
                if (local_1a0 != (void *)0x0) {
                  free(local_1a0);
                }
              }
              else {
                (*local_180->_vptr_Allocator[3])();
              }
            }
          }
          ppvVar10 = local_b0;
          *(undefined8 *)((long)local_b0 + 0xc) = 0;
          *(undefined8 *)((long)ppvVar10 + 0x14) = 0;
          *ppvVar10 = (void *)0x0;
          ppvVar10[1] = (void *)0x0;
          puVar9 = local_b8;
          *local_b8 = 0;
          puVar9[1] = 0;
          *(undefined4 *)(puVar9 + 2) = 0;
          piStack_198 = (int *)0x0;
          local_178 = 1;
          uStack_174 = 1;
          uStack_170 = 1;
          uStack_16c = 1;
          local_168 = 1;
          local_160 = 1;
          piVar6 = (int *)CONCAT44(local_2d8.refcount._4_4_,(int)local_2d8.refcount);
          local_1a0 = pvVar20;
          sStack_190 = sVar5;
          iStack_188 = iVar2;
          local_180 = pAVar19;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_2d8.allocator == (Allocator *)0x0) {
                if ((_func_int **)local_2d8.data != (_func_int **)0x0) {
                  free(local_2d8.data);
                }
              }
              else {
                (*(local_2d8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_2d8.cstep = 0;
          local_2d8.data = (void *)0x0;
          local_2d8.refcount._0_4_ = 0;
          local_2d8.refcount._4_4_ = 0;
          local_2d8.elemsize._0_4_ = 0;
          local_2d8.elemsize._4_4_ = 0;
          local_2d8.elempack = 0;
          local_2d8.dims = 0;
          local_2d8.w = 0;
          local_2d8.h = 0;
          local_2d8.d = 0;
          local_2d8.c = 0;
        }
        if (100 < (this->super_ConvolutionDepthWise).int8_scale_term) {
          sVar5 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elemsize;
          pvVar20 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.data;
          iVar2 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elempack;
          pAVar19 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.allocator;
          piVar6 = (int *)CONCAT44(uStack_14c,uStack_150);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_138 == (Allocator *)0x0) {
                if (local_158 != (void *)0x0) {
                  free(local_158);
                }
              }
              else {
                (*local_138->_vptr_Allocator[3])();
              }
            }
          }
          uStack_150 = 0;
          uStack_14c = 0;
          uStack_148 = (undefined4)sVar5;
          uStack_144 = (undefined4)(sVar5 >> 0x20);
          local_130 = 0x100000001;
          uStack_128 = 0x100000001;
          local_120 = 1;
          local_118 = 1;
          local_158 = (void *)(sVar5 * lVar22 + (long)pvVar20);
          iStack_140 = iVar2;
          local_138 = pAVar19;
        }
        in_ZMM10 = ZEXT1664(auVar26);
        in_ZMM11 = ZEXT1664(auVar38);
        ModelBinFromMatArray::ModelBinFromMatArray
                  ((ModelBinFromMatArray *)&local_2d8,(Mat *)local_278);
        (*pLVar14->_vptr_Layer[3])(pLVar14,&local_2d8);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_2d8);
        lVar15 = 0x120;
        do {
          piVar6 = *(int **)(local_278 + lVar15 + 8);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (*(long **)(local_278 + lVar15 + 0x20) == (long *)0x0) {
                if (*(void **)(local_278 + lVar15) != (void *)0x0) {
                  free(*(void **)(local_278 + lVar15));
                }
              }
              else {
                (**(code **)(**(long **)(local_278 + lVar15 + 0x20) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_238 + lVar15) = 0;
          *(undefined8 *)(local_278 + lVar15 + 0xc) = 0;
          *(undefined8 *)(local_278 + lVar15 + 0x14) = 0;
          *(undefined8 *)(local_278 + lVar15) = 0;
          *(undefined8 *)(local_278 + lVar15 + 8) = 0;
          *(undefined8 *)(local_278 + lVar15 + 0x28) = 0;
          *(undefined8 *)((long)local_240 + lVar15 + -8) = 0;
          *(undefined4 *)((long)local_240 + lVar15) = 0;
          lVar15 = lVar15 + -0x48;
        } while (lVar15 != -0x48);
      }
      (*pLVar14->_vptr_Layer[4])(pLVar14,local_60);
      (local_98->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar22] = pLVar14;
      ParamDict::~ParamDict(&local_40);
      piVar6 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_108.allocator == (Allocator *)0x0) {
            if (local_108.data != (void *)0x0) {
              free(local_108.data);
            }
          }
          else {
            (*(local_108.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_108.cstep = 0;
      local_108.data = (void *)0x0;
      local_108.refcount._0_4_ = 0;
      local_108.refcount._4_4_ = 0;
      local_108.elemsize._0_4_ = 0;
      local_108.elemsize._4_4_ = 0;
      local_108.elempack = 0;
      local_108.dims = 0;
      local_108.w = 0;
      local_108.h = 0;
      local_108.d = 0;
      local_108.c = 0;
      lVar22 = lVar22 + 1;
    } while (lVar22 < (this->super_ConvolutionDepthWise).group);
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_fma::create_group_ops(const Option& opt)
{
    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i = 0; i < (int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g = 0; g < group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g).clone();
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer_cpu(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g); // weight_data_size
        pd.set(8, int8_scale_term);
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[5];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[2] = weight_data_int8_scales_g;
                weights[3] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[4] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[4];
            weights[0] = weight_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[1] = weight_data_int8_scales_g;
                weights[2] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[3] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }

    return 0;
}